

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O0

void __thiscall
websocketpp::http::parser::response::process(response *this,iterator begin,iterator end)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end_00;
  bool bVar1;
  byte bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  undefined8 uVar4;
  size_type in_RDX;
  undefined8 in_RSI;
  istringstream ss;
  int code;
  iterator cursor_end;
  iterator cursor_start;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  parser *in_stack_fffffffffffffb80;
  response *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  string *body;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbb0;
  value vVar5;
  string *in_stack_fffffffffffffbb8;
  string *log_msg;
  exception *in_stack_fffffffffffffbc0;
  exception *this_01;
  undefined1 local_3e9 [56];
  undefined1 local_3b1;
  string local_3b0 [32];
  string local_390 [39];
  undefined1 local_369 [40];
  undefined1 local_341 [9];
  char *local_338;
  string local_330 [32];
  istringstream local_310 [384];
  value local_190;
  undefined1 local_189;
  string local_188 [32];
  undefined1 local_168 [40];
  string local_140 [39];
  undefined1 local_119;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_110;
  char *local_100;
  allocator<char> local_f1;
  char *local_f0;
  undefined8 local_e8;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [32];
  string local_98 [55];
  allocator local_61;
  string local_60 [39];
  undefined1 local_39;
  char *local_28;
  char *local_20;
  size_type local_10;
  
  local_39 = 0x20;
  local_20 = (char *)in_RSI;
  local_10 = in_RDX;
  local_28 = (char *)std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                               (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                                (char *)in_stack_fffffffffffffb88);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffb80,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  if (bVar1) {
    local_b9 = 1;
    uVar4 = __cxa_allocate_exception(0x70);
    vVar5 = (value)((ulong)in_stack_fffffffffffffbb0._M_current >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Invalid response line",&local_61);
    std::__cxx11::string::string(local_98);
    std::__cxx11::string::string(local_b8);
    exception::exception
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,vVar5,
               (string *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0);
    local_b9 = 0;
    __cxa_throw(uVar4,&exception::typeinfo,exception::~exception);
  }
  local_e8 = local_20;
  local_f0 = local_28;
  std::allocator<char>::allocator();
  _Var3._M_current._7_1_ = in_stack_fffffffffffffbaf;
  _Var3._M_current._0_7_ = in_stack_fffffffffffffba8;
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffbb0,_Var3,
             (allocator<char> *)in_stack_fffffffffffffb98._M_current);
  parser::set_version(in_stack_fffffffffffffb80,
                      (string *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_f1);
  local_110._M_allocated_capacity =
       (size_type)
       __gnu_cxx::
       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::operator+(in_stack_fffffffffffffb88,(difference_type)in_stack_fffffffffffffb80);
  local_118 = local_10;
  local_119 = 0x20;
  local_100 = (char *)local_110._M_allocated_capacity;
  local_20 = (char *)local_110._M_allocated_capacity;
  local_110._8_8_ =
       std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                 (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                  (char *)in_stack_fffffffffffffb88);
  local_28 = (char *)local_110._8_8_;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffb80,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  if (!bVar1) {
    local_338 = local_20;
    local_341._1_8_ = local_28;
    log_msg = (string *)local_341;
    std::allocator<char>::allocator();
    __end._M_current._7_1_ = in_stack_fffffffffffffbaf;
    __end._M_current._0_7_ = in_stack_fffffffffffffba8;
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffbb0,__end,
               (allocator<char> *)in_stack_fffffffffffffb98._M_current);
    std::__cxx11::istringstream::istringstream(local_310,local_330,8);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)local_341);
    _Var3._M_current = (char *)std::istream::operator>>(local_310,(int *)&local_190);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) == 0) {
      local_3e9._9_8_ =
           __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator+(in_stack_fffffffffffffb88,(difference_type)in_stack_fffffffffffffb80);
      local_3e9._1_8_ = local_10;
      this_00 = (response *)local_3e9;
      std::allocator<char>::allocator();
      __end_00._M_current._7_1_ = bVar2;
      __end_00._M_current._0_7_ = in_stack_fffffffffffffba8;
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (in_stack_fffffffffffffba0,_Var3,__end_00,
                 (allocator<char> *)in_stack_fffffffffffffb98._M_current);
      set_status(this_00,local_190,(string *)0x310431);
      std::__cxx11::string::~string((string *)(local_3e9 + 0x11));
      std::allocator<char>::~allocator((allocator<char> *)local_3e9);
      std::__cxx11::istringstream::~istringstream(local_310);
      return;
    }
    local_3b1 = 1;
    uVar4 = __cxa_allocate_exception(0x70);
    vVar5 = (value)((ulong)_Var3._M_current >> 0x20);
    body = (string *)local_369;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_369 + 1),"Unable to parse response code",(allocator *)body);
    std::__cxx11::string::string(local_390);
    std::__cxx11::string::string(local_3b0);
    exception::exception
              (in_stack_fffffffffffffbc0,log_msg,vVar5,
               (string *)CONCAT17(bVar2,in_stack_fffffffffffffba8),body);
    local_3b1 = 0;
    __cxa_throw(uVar4,&exception::typeinfo,exception::~exception);
  }
  local_189 = 1;
  uVar4 = __cxa_allocate_exception(0x70);
  vVar5 = (value)((ulong)in_stack_fffffffffffffbb0._M_current >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"Invalid request line",(allocator *)(local_168 + 0x27));
  this_01 = (exception *)local_168;
  std::__cxx11::string::string((string *)this_01);
  std::__cxx11::string::string(local_188);
  exception::exception
            (this_01,in_stack_fffffffffffffbb8,vVar5,
             (string *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
             in_stack_fffffffffffffba0);
  local_189 = 0;
  __cxa_throw(uVar4,&exception::typeinfo,exception::~exception);
}

Assistant:

inline void response::process(std::string::iterator begin,
    std::string::iterator end)
{
    std::string::iterator cursor_start = begin;
    std::string::iterator cursor_end = std::find(begin,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid response line",status_code::bad_request);
    }

    set_version(std::string(cursor_start,cursor_end));

    cursor_start = cursor_end+1;
    cursor_end = std::find(cursor_start,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line",status_code::bad_request);
    }

    int code;

    std::istringstream ss(std::string(cursor_start,cursor_end));

    if ((ss >> code).fail()) {
        throw exception("Unable to parse response code",status_code::bad_request);
    }

    set_status(status_code::value(code),std::string(cursor_end+1,end));
}